

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTranslate.cpp
# Opt level: O1

void TranslateIntegerLiteral(ExpressionTranslateContext *ctx,ExprIntegerLiteral *expression)

{
  TypeBase *type;
  ExpressionContext *pEVar1;
  ulong uVar2;
  char *format;
  
  type = (expression->super_ExprBase).type;
  pEVar1 = ctx->ctx;
  if (type == pEVar1->typeShort) {
    uVar2 = (ulong)(uint)(int)(short)expression->value;
    format = "((short)%d)";
  }
  else if (type == pEVar1->typeInt) {
    uVar2 = (ulong)(uint)expression->value;
    format = "%d";
  }
  else {
    if (type == pEVar1->typeLong) {
      Print(ctx,"%lldll",expression->value);
      return;
    }
    if ((type == (TypeBase *)0x0) || (type->typeID != 0x19)) {
      __assert_fail("!\"unknown type\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTranslate.cpp"
                    ,0x1fc,
                    "void TranslateIntegerLiteral(ExpressionTranslateContext &, ExprIntegerLiteral *)"
                   );
    }
    TranslateTypeName(ctx,type);
    uVar2 = (ulong)(uint)expression->value;
    format = "(%d)";
  }
  Print(ctx,format,uVar2);
  return;
}

Assistant:

void TranslateIntegerLiteral(ExpressionTranslateContext &ctx, ExprIntegerLiteral *expression)
{
	if(expression->type == ctx.ctx.typeShort)
	{
		Print(ctx, "((short)%d)", short(expression->value));
	}
	else if(expression->type == ctx.ctx.typeInt)
	{
		Print(ctx, "%d", int(expression->value));
	}
	else if(expression->type == ctx.ctx.typeLong)
	{
		Print(ctx, "%lldll", expression->value);
	}
	else if(isType<TypeEnum>(expression->type))
	{
		TranslateTypeName(ctx, expression->type);
		Print(ctx, "(%d)", int(expression->value));
	}
	else
	{
		assert(!"unknown type");
	}
}